

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O2

uint32_t __thiscall asmjit::InstNode::getRewriteIndex(InstNode *this,uint32_t *id)

{
  ulong uVar1;
  uint32_t *puVar2;
  
  puVar2 = &(this->_baseInst)._extraReg._id;
  if (id < puVar2) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/../core/builder.h"
               ,0x37b,"array <= id");
  }
  uVar1 = (long)id - (long)puVar2 >> 2;
  if (uVar1 < 0x20) {
    return (uint32_t)uVar1;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/x86/../x86/../core/../core/builder.h"
             ,0x37e,"index < 32");
}

Assistant:

ASMJIT_INLINE uint32_t getRewriteIndex(const uint32_t* id) const noexcept {
    const uint32_t* array = _getRewriteArray();
    ASMJIT_ASSERT(array <= id);

    size_t index = (size_t)(id - array);
    ASMJIT_ASSERT(index < 32);

    return uint32_t(index);
  }